

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

void __thiscall Lowerer::GenerateFastInlineIsArray(Lowerer *this,Instr *instr)

{
  Opnd *dst;
  Opnd *this_00;
  _func_int **pp_Var1;
  Instr *argoutInlineSpecialized;
  Func *pFVar2;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  uint32 offset;
  int iVar6;
  undefined4 *puVar7;
  LabelInstr *target;
  LabelInstr *target_00;
  RegOpnd *pRVar8;
  LabelInstr *target_01;
  RegOpnd *baseOpnd;
  IndirOpnd *pIVar9;
  IntConstOpnd *pIVar10;
  undefined4 extraout_var;
  AddrOpnd *pAVar11;
  undefined4 extraout_var_00;
  Lowerer *pLVar12;
  undefined1 local_a8 [8];
  AutoReuseOpnd autoReuseTypeOpnd;
  AutoReuseOpnd autoReuseTypeIdOpnd;
  Opnd *argsOpnd [2];
  anon_union_2_4_ea848c7b_for_ValueType_13 local_3a;
  LabelInstr *pLStack_38;
  ValueType valueType;
  
  if (instr->m_opcode != CallDirect) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4eb2,"(instr->m_opcode == Js::OpCode::CallDirect)",
                       "instr->m_opcode == Js::OpCode::CallDirect");
    if (!bVar4) goto LAB_005aac98;
    *puVar7 = 0;
  }
  dst = instr->m_dst;
  if (dst == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4eb5,"(dst)","dst");
    if (!bVar4) goto LAB_005aac98;
    *puVar7 = 0;
  }
  this_00 = instr->m_src2;
  OVar5 = IR::Opnd::GetKind(this_00);
  if (OVar5 != OpndKindSym) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
    if (!bVar4) goto LAB_005aac98;
    *puVar7 = 0;
  }
  pp_Var1 = this_00[1]._vptr_Opnd;
  if (*(char *)((long)pp_Var1 + 0x14) != '\x01') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                       ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
    if (!bVar4) goto LAB_005aac98;
    *puVar7 = 0;
  }
  argoutInlineSpecialized = (Instr *)pp_Var1[5];
  autoReuseTypeIdOpnd.autoDelete = false;
  autoReuseTypeIdOpnd.wasInUse = false;
  autoReuseTypeIdOpnd._18_6_ = 0;
  bVar4 = IR::Instr::FetchOperands(instr,(Opnd **)&autoReuseTypeIdOpnd.autoDelete,2);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4ebe,"(result)","result");
    if (!bVar4) goto LAB_005aac98;
    *puVar7 = 0;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar7 = 1;
  bVar4 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                     ,0x4ebf,"(argsOpnd[1])","argsOpnd[1]");
  if (bVar4) {
    *puVar7 = 0;
    target = IR::LabelInstr::New(Label,instr->m_func,true);
    IR::Instr::InsertBefore(instr,&target->super_Instr);
    pLVar12 = (Lowerer *)0x0;
    target_00 = InsertLabel(false,instr->m_next);
    local_3a = _DAT_00000008;
    pRVar8 = GetRegOpnd(pLVar12,(Opnd *)0x0,&target->super_Instr,this->m_func,DAT_0000000a);
    pFVar2 = this->m_func;
    bVar4 = ValueType::IsLikelyArray((ValueType *)&local_3a.field_0);
    target_01 = IR::LabelInstr::New(Label,pFVar2,bVar4);
    pFVar2 = this->m_func;
    bVar4 = ValueType::IsLikelyArray((ValueType *)&local_3a.field_0);
    pLStack_38 = IR::LabelInstr::New(Label,pFVar2,bVar4);
    bVar4 = IR::Opnd::IsNotTaggedValue(&pRVar8->super_Opnd);
    if (!bVar4) {
      LowererMD::GenerateObjectTest
                (&this->m_lowererMD,&pRVar8->super_Opnd,&target->super_Instr,pLStack_38,false);
    }
    baseOpnd = IR::RegOpnd::New(TyUint64,this->m_func);
    local_a8 = (undefined1  [8])0x0;
    IR::AutoReuseOpnd::Initialize((AutoReuseOpnd *)local_a8,&baseOpnd->super_Opnd,this->m_func,true)
    ;
    pIVar9 = IR::IndirOpnd::New(pRVar8,8,TyUint64,this->m_func,false);
    InsertMove(&baseOpnd->super_Opnd,&pIVar9->super_Opnd,&target->super_Instr,true);
    pRVar8 = IR::RegOpnd::New(TyUint64,this->m_func);
    autoReuseTypeOpnd.autoDelete = false;
    autoReuseTypeOpnd.wasInUse = false;
    autoReuseTypeOpnd._18_6_ = 0;
    IR::AutoReuseOpnd::Initialize
              ((AutoReuseOpnd *)&autoReuseTypeOpnd.autoDelete,&pRVar8->super_Opnd,this->m_func,true)
    ;
    offset = Js::Type::GetOffsetOfTypeId();
    pIVar9 = IR::IndirOpnd::New(baseOpnd,offset,TyInt32,this->m_func,false);
    InsertMove(&pRVar8->super_Opnd,&pIVar9->super_Opnd,&target->super_Instr,true);
    pLVar12 = (Lowerer *)0x1d;
    pIVar10 = IR::IntConstOpnd::New(0x1d,TyInt32,this->m_func,false);
    InsertCompareBranch(pLVar12,&pRVar8->super_Opnd,&pIVar10->super_Opnd,BrLt_A,false,target_01,
                        &target->super_Instr,false);
    pLVar12 = (Lowerer *)0x21;
    pIVar10 = IR::IntConstOpnd::New(0x21,TyInt32,this->m_func,false);
    InsertCompareBranch(pLVar12,&pRVar8->super_Opnd,&pIVar10->super_Opnd,BrGt_A,false,pLStack_38,
                        &target->super_Instr,false);
    iVar6 = (*instr->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo[2])();
    pAVar11 = IR::AddrOpnd::New(CONCAT44(extraout_var,iVar6),AddrOpndKindDynamicVar,instr->m_func,
                                true,(Var)0x0);
    InsertMove(dst,&pAVar11->super_Opnd,&target->super_Instr,true);
    InsertBranch(Br,false,target_00,&target->super_Instr);
    IR::Instr::InsertBefore(&target->super_Instr,&target_01->super_Instr);
    pLVar12 = (Lowerer *)0x1a;
    pIVar10 = IR::IntConstOpnd::New(0x1a,TyInt32,this->m_func,false);
    InsertCompareBranch(pLVar12,&pRVar8->super_Opnd,&pIVar10->super_Opnd,BrEq_A,false,target,
                        &target->super_Instr,false);
    pLVar12 = (Lowerer *)0x17;
    pIVar10 = IR::IntConstOpnd::New(0x17,TyInt32,this->m_func,false);
    InsertCompareBranch(pLVar12,&pRVar8->super_Opnd,&pIVar10->super_Opnd,BrEq_A,false,target,
                        &target->super_Instr,false);
    IR::Instr::InsertBefore(&target->super_Instr,&pLStack_38->super_Instr);
    iVar6 = (*instr->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo[3])();
    pAVar11 = IR::AddrOpnd::New(CONCAT44(extraout_var_00,iVar6),AddrOpndKindDynamicVar,instr->m_func
                                ,true,(Var)0x0);
    InsertMove(dst,&pAVar11->super_Opnd,&target->super_Instr,true);
    pLVar12 = (Lowerer *)0x9;
    InsertBranch(Br,false,target_00,&target->super_Instr);
    RelocateCallDirectToHelperPath(pLVar12,argoutInlineSpecialized,target);
    IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&autoReuseTypeOpnd.autoDelete);
    IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_a8);
    return;
  }
LAB_005aac98:
  pcVar3 = (code *)invalidInstructionException();
  (*pcVar3)();
}

Assistant:

void
Lowerer::GenerateFastInlineIsArray(IR::Instr * instr)
{
    Assert(instr->m_opcode == Js::OpCode::CallDirect);

    IR::Opnd * dst = instr->GetDst();
    Assert(dst);

    //CallDirect src2
    IR::Opnd * linkOpnd = instr->GetSrc2();
    //ArgOut_A_InlineSpecialized
    IR::Instr * tmpInstr = linkOpnd->AsSymOpnd()->m_sym->AsStackSym()->m_instrDef;

    IR::Opnd * argsOpnd[2] = { 0 };
    bool result = instr->FetchOperands(argsOpnd, 2);
    Assert(result);
    AnalysisAssert(argsOpnd[1]);

    IR::LabelInstr *helperLabel = InsertLabel(true, instr);
    IR::Instr * insertInstr = helperLabel;
    IR::LabelInstr *doneLabel = InsertLabel(false, instr->m_next);

    ValueType valueType = argsOpnd[1]->GetValueType();
    IR::RegOpnd * src = GetRegOpnd(argsOpnd[1], insertInstr, m_func, argsOpnd[1]->GetType());

    IR::LabelInstr *checkNotArrayLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func, valueType.IsLikelyArray());
    IR::LabelInstr *notArrayLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func, valueType.IsLikelyArray());

    if (!src->IsNotTaggedValue())
    {
        m_lowererMD.GenerateObjectTest(src, insertInstr, notArrayLabel);
    }

    //  MOV typeOpnd, [opnd + offset(type)]
    IR::RegOpnd *typeOpnd = IR::RegOpnd::New(TyMachPtr, m_func);
    const IR::AutoReuseOpnd autoReuseTypeOpnd(typeOpnd, m_func);
    IR::IndirOpnd *indirOpnd = IR::IndirOpnd::New(src, Js::RecyclableObject::GetOffsetOfType(), TyMachPtr, m_func);
    InsertMove(typeOpnd, indirOpnd, insertInstr);

    //  MOV typeIdOpnd, [typeOpnd + offset(typeId)]
    IR::RegOpnd *typeIdOpnd = IR::RegOpnd::New(TyMachPtr, m_func);
    const IR::AutoReuseOpnd autoReuseTypeIdOpnd(typeIdOpnd, m_func);
    indirOpnd = IR::IndirOpnd::New(typeOpnd, Js::Type::GetOffsetOfTypeId(), TyInt32, m_func);
    InsertMove(typeIdOpnd, indirOpnd, insertInstr);

    //  CMP typeIdOpnd, TypeIds_ArrayFirst
    //  JLT $notArray
    InsertCompareBranch(
        typeIdOpnd,
        IR::IntConstOpnd::New(Js::TypeIds_ArrayFirst, TyInt32, m_func),
        Js::OpCode::BrLt_A,
        checkNotArrayLabel,
        insertInstr);
    //  CMP typeIdOpnd, TypeIds_ArrayLastWithES5
    //  JGT $notArray
    InsertCompareBranch(
        typeIdOpnd,
        IR::IntConstOpnd::New(Js::TypeIds_ArrayLastWithES5, TyInt32, m_func),
        Js::OpCode::BrGt_A,
        notArrayLabel,
        insertInstr);

    // MOV dst, True
    InsertMove(dst, LoadLibraryValueOpnd(instr, LibraryValue::ValueTrue), insertInstr);

    // JMP $done
    InsertBranch(Js::OpCode::Br, doneLabel, insertInstr);

    // $checkNotArray:
    insertInstr->InsertBefore(checkNotArrayLabel);

    //  CMP typeIdOpnd, TypeIds_Proxy
    //  JEQ $helperLabel
    InsertCompareBranch(
        typeIdOpnd,
        IR::IntConstOpnd::New(Js::TypeIds_Proxy, TyInt32, m_func),
        Js::OpCode::BrEq_A,
        helperLabel,
        insertInstr);
    CompileAssert(Js::TypeIds_Proxy < Js::TypeIds_ArrayFirst);

    //  CMP typeIdOpnd, TypeIds_HostDispatch
    //  JEQ $helperLabel
    InsertCompareBranch(
        typeIdOpnd,
        IR::IntConstOpnd::New(Js::TypeIds_HostDispatch, TyInt32, m_func),
        Js::OpCode::BrEq_A,
        helperLabel,
        insertInstr);
    CompileAssert(Js::TypeIds_HostDispatch < Js::TypeIds_ArrayFirst);

    // $notObjectLabel:
    insertInstr->InsertBefore(notArrayLabel);

    // MOV dst, False
    InsertMove(dst, LoadLibraryValueOpnd(instr, LibraryValue::ValueFalse), insertInstr);

    InsertBranch(Js::OpCode::Br, doneLabel, insertInstr);

    RelocateCallDirectToHelperPath(tmpInstr, helperLabel);
}